

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioCreateWithCustomAllocatorEXT
                   (FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc)

{
  FAudio *pFVar1;
  float *pfVar2;
  
  FAudioCOMConstructWithCustomAllocatorEXT(ppFAudio,'\b',customMalloc,customFree,customRealloc);
  pFVar1 = *ppFAudio;
  pfVar2 = (float *)(*pFVar1->pMalloc)(4);
  pFVar1->decodeCache = pfVar2;
  pfVar2 = (float *)(*pFVar1->pMalloc)(4);
  pFVar1->resampleCache = pfVar2;
  pFVar1->decodeSamples = 1;
  pFVar1->resampleSamples = 1;
  pFVar1->active = '\x01';
  return 0;
}

Assistant:

uint32_t FAudioCreateWithCustomAllocatorEXT(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		FAUDIO_TARGET_VERSION,
		customMalloc,
		customFree,
		customRealloc
	);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}